

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walRewriteChecksums(Wal *pWal,u32 iLast)

{
  u32 uVar1;
  u32 uVar2;
  u32 nTruncate;
  long offset;
  u32 nDbSize;
  u32 iPgno;
  i64 iOff;
  i64 iCksumOff;
  u8 local_48 [4];
  u32 iRead;
  u8 aFrame [24];
  u8 *aBuf;
  int rc;
  int szPage;
  u32 iLast_local;
  Wal *pWal_local;
  
  uVar1 = pWal->szPage;
  aFrame._16_8_ = sqlite3_malloc(uVar1 + 0x18);
  if ((void *)aFrame._16_8_ == (void *)0x0) {
    pWal_local._4_4_ = 7;
  }
  else {
    if (pWal->iReCksum == 1) {
      iOff = 0x18;
    }
    else {
      iOff = (ulong)(pWal->iReCksum - 2) * (long)(int)(uVar1 + 0x18) + 0x30;
    }
    aBuf._4_4_ = sqlite3OsRead(pWal->pWalFd,(void *)aFrame._16_8_,8,iOff);
    uVar2 = sqlite3Get4byte((u8 *)aFrame._16_8_);
    (pWal->hdr).aFrameCksum[0] = uVar2;
    uVar2 = sqlite3Get4byte((u8 *)(aFrame._16_8_ + 4));
    (pWal->hdr).aFrameCksum[1] = uVar2;
    iCksumOff._4_4_ = pWal->iReCksum;
    pWal->iReCksum = 0;
    for (; aBuf._4_4_ == 0 && iCksumOff._4_4_ <= iLast; iCksumOff._4_4_ = iCksumOff._4_4_ + 1) {
      offset = (ulong)(iCksumOff._4_4_ - 1) * (long)(int)(uVar1 + 0x18) + 0x20;
      aBuf._4_4_ = sqlite3OsRead(pWal->pWalFd,(void *)aFrame._16_8_,uVar1 + 0x18,offset);
      if (aBuf._4_4_ == 0) {
        uVar2 = sqlite3Get4byte((u8 *)aFrame._16_8_);
        nTruncate = sqlite3Get4byte((u8 *)(aFrame._16_8_ + 4));
        walEncodeFrame(pWal,uVar2,nTruncate,(u8 *)(aFrame._16_8_ + 0x18),local_48);
        aBuf._4_4_ = sqlite3OsWrite(pWal->pWalFd,local_48,0x18,offset);
      }
    }
    sqlite3_free((void *)aFrame._16_8_);
    pWal_local._4_4_ = aBuf._4_4_;
  }
  return pWal_local._4_4_;
}

Assistant:

static int walRewriteChecksums(Wal *pWal, u32 iLast){
  const int szPage = pWal->szPage;/* Database page size */
  int rc = SQLITE_OK;             /* Return code */
  u8 *aBuf;                       /* Buffer to load data from wal file into */
  u8 aFrame[WAL_FRAME_HDRSIZE];   /* Buffer to assemble frame-headers in */
  u32 iRead;                      /* Next frame to read from wal file */
  i64 iCksumOff;

  aBuf = sqlite3_malloc(szPage + WAL_FRAME_HDRSIZE);
  if( aBuf==0 ) return SQLITE_NOMEM_BKPT;

  /* Find the checksum values to use as input for the recalculating the
  ** first checksum. If the first frame is frame 1 (implying that the current
  ** transaction restarted the wal file), these values must be read from the
  ** wal-file header. Otherwise, read them from the frame header of the
  ** previous frame.  */
  assert( pWal->iReCksum>0 );
  if( pWal->iReCksum==1 ){
    iCksumOff = 24;
  }else{
    iCksumOff = walFrameOffset(pWal->iReCksum-1, szPage) + 16;
  }
  rc = sqlite3OsRead(pWal->pWalFd, aBuf, sizeof(u32)*2, iCksumOff);
  pWal->hdr.aFrameCksum[0] = sqlite3Get4byte(aBuf);
  pWal->hdr.aFrameCksum[1] = sqlite3Get4byte(&aBuf[sizeof(u32)]);

  iRead = pWal->iReCksum;
  pWal->iReCksum = 0;
  for(; rc==SQLITE_OK && iRead<=iLast; iRead++){
    i64 iOff = walFrameOffset(iRead, szPage);
    rc = sqlite3OsRead(pWal->pWalFd, aBuf, szPage+WAL_FRAME_HDRSIZE, iOff);
    if( rc==SQLITE_OK ){
      u32 iPgno, nDbSize;
      iPgno = sqlite3Get4byte(aBuf);
      nDbSize = sqlite3Get4byte(&aBuf[4]);

      walEncodeFrame(pWal, iPgno, nDbSize, &aBuf[WAL_FRAME_HDRSIZE], aFrame);
      rc = sqlite3OsWrite(pWal->pWalFd, aFrame, sizeof(aFrame), iOff);
    }
  }

  sqlite3_free(aBuf);
  return rc;
}